

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_59::AppendableFileImpl::~AppendableFileImpl(AppendableFileImpl *this)

{
  AppendableFileImpl *this_local;
  
  ~AppendableFileImpl(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

AppendableFileImpl(Own<const File>&& fileParam): file(kj::mv(fileParam)) {}